

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDEdge::TaggedEndIndex(ON_SubDEdge *this)

{
  bool bVar1;
  uint local_2c;
  ON_SubDVertex *v;
  uint evi;
  uint tagged_end_index;
  ON_SubDEdge *this_local;
  
  v._4_4_ = 3;
  for (v._0_4_ = 0; (uint)v < 2; v._0_4_ = (uint)v + 1) {
    if ((this->m_vertex[(uint)v] != (ON_SubDVertex *)0x0) &&
       (bVar1 = ON_SubDVertex::IsDartOrCreaseOrCorner(this->m_vertex[(uint)v]), bVar1)) {
      if (v._4_4_ == 3) {
        local_2c = (uint)v;
      }
      else {
        local_2c = 2;
      }
      v._4_4_ = local_2c;
    }
  }
  return v._4_4_;
}

Assistant:

unsigned int ON_SubDEdge::TaggedEndIndex() const
{
  unsigned int tagged_end_index = 3;
  for (unsigned int evi = 0; evi < 2; evi++)
  {
    const ON_SubDVertex* v = m_vertex[evi];
    if (nullptr == v || false == v->IsDartOrCreaseOrCorner())
      continue;
    tagged_end_index = (3 == tagged_end_index) ? evi : 2;
  }
  return tagged_end_index;
}